

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::details::ap_file_observer::make_observation<double>
          (ap_file_observer *this,sparse_matrix<int> *ap,double *P,double *param_3)

{
  int *piVar1;
  int iVar2;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  int k;
  int iVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  basic_string_view<char> bVar4;
  format_args args;
  undefined1 local_288 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_278;
  ostream *local_260;
  unique_ptr<baryonyx::sparse_matrix<int>::col_value[],_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_258;
  string local_250;
  ofstream ofs;
  
  local_278._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_ = 0;
  local_278._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_ = this->m_frame;
  this->m_frame = this->m_frame + 1;
  local_288._0_8_ = (this->m_basename)._M_dataplus._M_p;
  local_288._8_8_ = (this->m_basename)._M_string_length;
  bVar4 = ::fmt::v7::to_string_view<char,_0>("{}-P-{}.txt");
  format_str.data_ = (char *)bVar4.size_;
  format_str.size_ = 0x1d;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_288;
  ::fmt::v7::detail::vformat_abi_cxx11_(&local_250,(detail *)bVar4.data_,format_str,args);
  std::ofstream::ofstream((ostream *)&ofs,(string *)&local_250,_S_out);
  std::__cxx11::string::~string((string *)&local_250);
  for (iVar3 = 0; iVar3 != this->constraints; iVar3 = iVar3 + 1) {
    local_288._0_8_ = local_288._0_8_ & 0xffffffff00000000;
    std::
    __fill_n_a<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,int,float>
              ((this->m_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,this->variables,local_288);
    sparse_matrix<int>::row((sparse_matrix<int> *)local_288,(int)ap);
    __last._M_current =
         (this->m_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (local_288._8_8_ != local_288._0_8_) {
      iVar2 = *(int *)local_288._8_8_;
      piVar1 = (int *)(local_288._8_8_ + 4);
      local_288._8_8_ = local_288._8_8_ + 8;
      __last._M_current[*piVar1] = (float)P[iVar2];
    }
    local_258._M_t.
    super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>,_true,_true>
          )((long)"\n  " + 2);
    local_260 = (ostream *)&ofs;
    std::
    copy<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::ostream_iterator<double,char,std::char_traits<char>>>
              ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)&local_250,
               __last,(ostream_iterator<double,_char,_std::char_traits<char>_> *)
                      (this->m_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    std::operator<<((ostream *)&ofs,'\n');
  }
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& ap,
                          const Float* P,
                          const Float* /*pi*/)
    {
        static_assert(std::is_floating_point<Float>::value);

        std::ofstream ofs(fmt::format("{}-P-{}.txt", m_basename, m_frame++));

        for (int k = 0; k != constraints; ++k) {
            std::fill_n(std::begin(m_value), variables, 0.0f);

            auto [it, et] = ap.row(k);
            for (; it != et; ++it)
                m_value[it->column] = static_cast<float>(P[it->value]);

            std::copy(m_value.begin(),
                      m_value.end(),
                      std::ostream_iterator<Float>(ofs, " "));

            ofs << '\n';
        }
    }